

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_singlestep_exception(DisasContext_conflict1 *s)

{
  if (s->ss_active == true) {
    gen_ss_advance(s);
    gen_swstep_exception(s,1,(uint)s->is_ldex);
    (s->base).is_jmp = DISAS_NORETURN;
    return;
  }
  gen_exception_internal(s->uc->tcg_ctx,0x10002);
  return;
}

Assistant:

static void gen_singlestep_exception(DisasContext *s)
{
    /* Generate the right kind of exception for singlestep, which is
     * either the architectural singlestep or EXCP_DEBUG for QEMU's
     * gdb singlestepping.
     */
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (s->ss_active) {
        gen_step_complete_exception(s);
    } else {
        gen_exception_internal(tcg_ctx, EXCP_DEBUG);
    }
}